

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbustraytypes.cpp
# Opt level: O0

QDBusArgument * operator>>(QDBusArgument *argument,QXdgDBusImageStruct *icon)

{
  int *in_RSI;
  QDBusArgument *in_RDI;
  long in_FS_OFFSET;
  QByteArray data;
  qint32 height;
  qint32 width;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = -0x55555556;
  local_10 = -0x55555556;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0xb33b59);
  QDBusArgument::beginStructure();
  QDBusArgument::operator>>(in_RDI,&local_c);
  QDBusArgument::operator>>(in_RDI,&local_10);
  QDBusArgument::operator>>(in_RDI,(QByteArray *)&local_28);
  QDBusArgument::endStructure();
  *in_RSI = local_c;
  in_RSI[1] = local_10;
  QByteArray::operator=((QByteArray *)(in_RSI + 2),(QByteArray *)&local_28);
  QByteArray::~QByteArray((QByteArray *)0xb33bd5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

const QDBusArgument &operator>>(const QDBusArgument &argument, QXdgDBusImageStruct &icon)
{
    qint32 width;
    qint32 height;
    QByteArray data;

    argument.beginStructure();
    argument >> width;
    argument >> height;
    argument >> data;
    argument.endStructure();

    icon.width = width;
    icon.height = height;
    icon.data = data;

    return argument;
}